

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtest.cpp
# Opt level: O1

void __thiscall
DumpMetaArrayVal<signed_char>::operator()
          (DumpMetaArrayVal<signed_char> *this,PtexMetaData *meta,char *key)

{
  ulong uVar1;
  ulong uVar2;
  int count;
  char *val;
  char local_3d;
  uint local_3c;
  long local_38;
  
  local_38 = 0;
  local_3c = 0;
  (*meta->_vptr_PtexMetaData[8])(meta,key,&local_38,&local_3c);
  uVar1 = (ulong)local_3c;
  if (0 < (int)local_3c) {
    uVar2 = 0;
    do {
      if (((int)uVar2 == (int)((uVar2 & 0xffffffff) / 10) * 10) && (uVar2 != 0 || 10 < (int)uVar1))
      {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n  ",3);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  ",2);
      local_3d = *(char *)(local_38 + uVar2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,&local_3d,1);
      uVar2 = uVar2 + 1;
      uVar1 = (ulong)(int)local_3c;
    } while ((long)uVar2 < (long)uVar1);
  }
  return;
}

Assistant:

void operator()(PtexMetaData* meta, const char* key)
    {
        const T* val=0;
        int count=0;
        meta->getValue(key, val, count);
        for (int i = 0; i < count; i++) {
            if (i%10==0 && (i || count > 10)) std::cout << "\n  ";
            std::cout <<  "  " << val[i];
        }
    }